

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O0

void cave_free(chunk_conflict *c)

{
  _Bool _Var1;
  loc_conflict grid;
  chunk *local_38;
  int local_24;
  int local_20;
  wchar_t i;
  wchar_t x;
  wchar_t y;
  chunk_conflict *p_c;
  chunk_conflict *c_local;
  
  if ((c == cave) && (player != (player *)0x0)) {
    local_38 = (chunk *)player->cave;
  }
  else {
    local_38 = (chunk *)0x0;
  }
  cave_connectors_free(c->join);
  for (local_24 = 1; local_24 < (int)(uint)c->obj_max; local_24 = local_24 + 1) {
    if ((c->objects[local_24] != (object *)0x0) &&
       (_Var1 = loc_is_zero((loc)c->objects[local_24]->grid), _Var1)) {
      object_delete((chunk *)c,local_38,c->objects + local_24);
    }
  }
  for (i = L'\0'; i < c->height; i = i + L'\x01') {
    for (local_20 = 0; local_20 < c->width; local_20 = local_20 + 1) {
      mem_free(c->squares[i][local_20].info);
      if (c->squares[i][local_20].trap != (trap *)0x0) {
        grid = (loc_conflict)loc(local_20,i);
        square_free_trap((chunk_conflict2 *)c,grid);
      }
      if (c->squares[i][local_20].obj != (object *)0x0) {
        object_pile_free((chunk *)c,local_38,c->squares[i][local_20].obj);
      }
    }
    mem_free(c->squares[i]);
    mem_free((c->noise).grids[i]);
    mem_free((c->scent).grids[i]);
  }
  mem_free(c->squares);
  mem_free((c->noise).grids);
  mem_free((c->scent).grids);
  mem_free(c->feat_count);
  mem_free(c->objects);
  mem_free(c->monsters);
  mem_free(c->monster_groups);
  if (c->name != (char *)0x0) {
    string_free(c->name);
  }
  mem_free(c);
  return;
}

Assistant:

void cave_free(struct chunk *c) {
	struct chunk *p_c = (c == cave && player) ? player->cave : NULL;
	int y, x, i;

	cave_connectors_free(c->join);

	/* Look for orphaned objects and delete them. */
	for (i = 1; i < c->obj_max; i++) {
		if (c->objects[i] && loc_is_zero(c->objects[i]->grid)) {
			object_delete(c, p_c, &c->objects[i]);
		}
	}

	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			mem_free(c->squares[y][x].info);
			if (c->squares[y][x].trap)
				square_free_trap(c, loc(x, y));
			if (c->squares[y][x].obj)
				object_pile_free(c, p_c, c->squares[y][x].obj);
		}
		mem_free(c->squares[y]);
		mem_free(c->noise.grids[y]);
		mem_free(c->scent.grids[y]);
	}
	mem_free(c->squares);
	mem_free(c->noise.grids);
	mem_free(c->scent.grids);

	mem_free(c->feat_count);
	mem_free(c->objects);
	mem_free(c->monsters);
	mem_free(c->monster_groups);
	if (c->name)
		string_free(c->name);
	mem_free(c);
}